

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<signed_char,signed_char>::
Flush<duckdb::BitpackingCompressionState<signed_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<signed_char,signed_char> *this)

{
  byte width;
  byte bVar1;
  bitpacking_width_t width_00;
  idx_t iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (*(idx_t *)(this + 0x1810) != 0) {
    if (((this[0x1830] == (BitpackingState<signed_char,signed_char>)0x0) &&
        (this[0x1829] != this[0x1828])) || (1 < (byte)((char)this[0x1833] - 1U))) {
      BitpackingState<signed_char,_signed_char>::CalculateFORStats
                ((BitpackingState<signed_char,_signed_char> *)this);
      BitpackingState<signed_char,_signed_char>::CalculateDeltaStats
                ((BitpackingState<signed_char,_signed_char> *)this);
      if (this[0x1831] == (BitpackingState<signed_char,signed_char>)0x1) {
        if ((this[0x182c] == this[0x182b]) && (((byte)this[0x1833] & 0xfe) != 4)) {
          BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
          WriteConstantDelta((char)this[0x182c],**(char **)(this + 0x808),*(idx_t *)(this + 0x1810),
                             *(char **)(this + 0x808),(bool *)(this + 0x1010),
                             *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 6;
          return true;
        }
        width = BitpackingPrimitives::MinimumBitWidth<signed_char,false>((char)this[0x182d]);
        bVar1 = BitpackingPrimitives::MinimumBitWidth<signed_char,true>((char)this[0x182a]);
        if ((width < bVar1) && (this[0x1833] != (BitpackingState<signed_char,signed_char>)0x5)) {
          BitpackingState<signed_char,_signed_char>::SubtractFrameOfReference<signed_char>
                    ((BitpackingState<signed_char,_signed_char> *)this,(char *)(this + 0x810),
                     (char)this[0x182b]);
          BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
          WriteDeltaFor((char *)(this + 0x810),(bool *)(this + 0x1010),width,(char)this[0x182b],
                        (char)this[0x182e],*(char **)(this + 0x808),*(idx_t *)(this + 0x1810),
                        *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 10;
          iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x1810),width);
          *(idx_t *)(this + 0x1818) = *(long *)(this + 0x1818) + iVar2;
          return true;
        }
      }
      if (this[0x1832] == (BitpackingState<signed_char,signed_char>)0x1) {
        width_00 = BitpackingPrimitives::MinimumBitWidth<signed_char,false>((char)this[0x182a]);
        BitpackingState<signed_char,_signed_char>::SubtractFrameOfReference<signed_char>
                  ((BitpackingState<signed_char,_signed_char> *)this,*(char **)(this + 0x808),
                   (char)this[0x1828]);
        BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteFor
                  (*(char **)(this + 0x808),(bool *)(this + 0x1010),width_00,(char)this[0x1828],
                   *(idx_t *)(this + 0x1810),*(void **)(this + 0x1820));
        iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x1810),width_00);
        *(idx_t *)(this + 0x1818) = iVar2 + *(long *)(this + 0x1818) + 9;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteConstant
                ((char)this[0x1829],*(idx_t *)(this + 0x1810),*(void **)(this + 0x1820),
                 (bool)this[0x1830]);
      *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 5;
    }
  }
  return bVar3;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}